

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O3

void link_dowork(LINK_HANDLE link)

{
  LIST_ITEM_HANDLE item_handle;
  int iVar1;
  tickcounter_ms_t in_RAX;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  LIST_ITEM_HANDLE pLVar2;
  ASYNC_OPERATION_HANDLE async_operation;
  tickcounter_ms_t current_tick;
  tickcounter_ms_t local_38;
  
  if (link == (LINK_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                 ,"link_dowork",0x647,1,"NULL link");
      return;
    }
  }
  else {
    local_38 = in_RAX;
    iVar1 = tickcounter_get_current_ms(link->tick_counter,&local_38);
    if (iVar1 == 0) {
      pLVar2 = singlylinkedlist_get_head_item(link->pending_deliveries);
      while (item_handle = pLVar2, item_handle != (LIST_ITEM_HANDLE)0x0) {
        pLVar2 = singlylinkedlist_get_next_item(item_handle);
        async_operation = (ASYNC_OPERATION_HANDLE)singlylinkedlist_item_get_value(item_handle);
        if (((async_operation != (ASYNC_OPERATION_HANDLE)0x0) &&
            (async_operation[6].async_operation_cancel_handler !=
             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0)) &&
           (async_operation[6].async_operation_cancel_handler <=
            (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)
            (local_38 - (long)async_operation[5].async_operation_cancel_handler))) {
          if (async_operation[2].async_operation_cancel_handler !=
              (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0) {
            (*async_operation[2].async_operation_cancel_handler)
                      ((ASYNC_OPERATION_HANDLE)async_operation[3].async_operation_cancel_handler);
          }
          iVar1 = singlylinkedlist_remove(link->pending_deliveries,item_handle);
          if ((iVar1 != 0) &&
             (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
             UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                       ,"link_dowork",0x668,1,"Cannot remove item from list");
          }
          async_operation_destroy(async_operation);
        }
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                   ,"link_dowork",0x64f,1,"Cannot get tick counter value");
      }
    }
  }
  return;
}

Assistant:

void link_dowork(LINK_HANDLE link)
{
    if (link == NULL)
    {
        LogError("NULL link");
    }
    else
    {
        tickcounter_ms_t current_tick;

        if (tickcounter_get_current_ms(link->tick_counter, &current_tick) != 0)
        {
            LogError("Cannot get tick counter value");
        }
        else
        {
            // go through all and find timed out deliveries
            LIST_ITEM_HANDLE item = singlylinkedlist_get_head_item(link->pending_deliveries);
            while (item != NULL)
            {
                LIST_ITEM_HANDLE next_item = singlylinkedlist_get_next_item(item);
                ASYNC_OPERATION_HANDLE delivery_instance_async_operation = (ASYNC_OPERATION_HANDLE)singlylinkedlist_item_get_value(item);
                if (delivery_instance_async_operation != NULL)
                {
                    DELIVERY_INSTANCE* delivery_instance = (DELIVERY_INSTANCE*)GET_ASYNC_OPERATION_CONTEXT(DELIVERY_INSTANCE, delivery_instance_async_operation);

                    if ((delivery_instance != NULL) &&
                        (delivery_instance->timeout != 0) &&
                        (current_tick - delivery_instance->start_tick >= delivery_instance->timeout))
                    {
                        if (delivery_instance->on_delivery_settled != NULL)
                        {
                            delivery_instance->on_delivery_settled(delivery_instance->callback_context, delivery_instance->delivery_id, LINK_DELIVERY_SETTLE_REASON_TIMEOUT, NULL);
                        }

                        if (singlylinkedlist_remove(link->pending_deliveries, item) != 0)
                        {
                            LogError("Cannot remove item from list");
                        }

                        async_operation_destroy(delivery_instance_async_operation);
                    }
                }

                item = next_item;
            }
        }
    }
}